

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  char *pcVar5;
  pointer ppcVar6;
  allocator local_141;
  ostream *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string localName;
  string local_f8;
  string *local_d8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_d0;
  string makeTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string makefile2;
  string makefileName;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = ruleFileStream;
  local_d0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)emitted;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets)
  ;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  local_d8 = &(this->super_cmLocalCommonGenerator).ConfigName;
  ppcVar6 = targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar6 ==
        targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&localName);
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
    if (TVar2 == EXECUTABLE) {
LAB_003cdae3:
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_d0,psVar3);
      GetRelativeTargetDirectory_abi_cxx11_(&makefile2,this,*ppcVar6);
      std::__cxx11::string::operator=((string *)&localName,(string *)&makefile2);
      std::__cxx11::string::~string((string *)&makefile2);
      std::__cxx11::string::append((char *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::__cxx11::string::string((string *)&makefile2,"CMakeFiles/",(allocator *)&makefileName);
      std::__cxx11::string::append((char *)&makefile2);
      GetRecursiveMakeCall(&makefileName,this,makefile2._M_dataplus._M_p,&localName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &makefileName);
      std::__cxx11::string::~string((string *)&makefileName);
      pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::__cxx11::string::string((string *)&makefileName,pcVar5,(allocator *)&makeTargetName);
      CreateCDCommand(this,&commands,pcVar4,&makefileName);
      std::__cxx11::string::~string((string *)&makefileName);
      WriteMakeRule(this,local_140,"Convenience name for target.",&localName,&depends,&commands,true
                    ,false);
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
      bVar1 = std::operator!=(&localName,psVar3);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&localName);
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        WriteMakeRule(this,local_140,"Convenience name for target.",psVar3,&depends,&commands,true,
                      false);
      }
      GetRelativeTargetDirectory_abi_cxx11_(&makefileName,this,*ppcVar6);
      std::__cxx11::string::append((char *)&makefileName);
      GetRelativeTargetDirectory_abi_cxx11_(&makeTargetName,this,*ppcVar6);
      std::__cxx11::string::append((char *)&makeTargetName);
      cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
      std::__cxx11::string::_M_assign((string *)&localName);
      std::__cxx11::string::append((char *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      GetRecursiveMakeCall(&local_f8,this,makefileName._M_dataplus._M_p,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::__cxx11::string::string((string *)&local_f8,pcVar5,&local_141);
      CreateCDCommand(this,&commands,pcVar4,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      WriteMakeRule(this,local_140,"fast build rule for target.",&localName,&depends,&commands,true,
                    false);
      bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(*ppcVar6,local_d8);
      if (bVar1) {
        GetRelativeTargetDirectory_abi_cxx11_(&local_f8,this,*ppcVar6);
        std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::append((char *)&makeTargetName);
        cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        std::__cxx11::string::_M_assign((string *)&localName);
        std::__cxx11::string::append((char *)&localName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        GetRecursiveMakeCall(&local_f8,this,makefile2._M_dataplus._M_p,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   &local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
        pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
        std::__cxx11::string::string((string *)&local_f8,pcVar5,&local_141);
        CreateCDCommand(this,&commands,pcVar4,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        WriteMakeRule(this,local_140,"Manual pre-install relink rule for target.",&localName,
                      &depends,&commands,true,false);
      }
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&makefileName);
      std::__cxx11::string::~string((string *)&makefile2);
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar2 == STATIC_LIBRARY) goto LAB_003cdae3;
      TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar2 == SHARED_LIBRARY) goto LAB_003cdae3;
      TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar2 == MODULE_LIBRARY) goto LAB_003cdae3;
      TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar2 == OBJECT_LIBRARY) goto LAB_003cdae3;
      TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar2 == UTILITY) goto LAB_003cdae3;
    }
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets(
  std::ostream& ruleFileStream, std::set<std::string>& emitted)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // for each target we just provide a rule to cd up to the top and do a make
  // on the target
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  std::string localName;
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if (((*t)->GetType() == cmStateEnums::EXECUTABLE) ||
        ((*t)->GetType() == cmStateEnums::STATIC_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::SHARED_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::MODULE_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::UTILITY)) {
      emitted.insert((*t)->GetName());

      // for subdirs add a rule to build this specific target by name.
      localName = this->GetRelativeTargetDirectory(*t);
      localName += "/rule";
      commands.clear();
      depends.clear();

      // Build the target for this pass.
      std::string makefile2 = cmake::GetCMakeFilesDirectoryPostSlash();
      makefile2 += "Makefile2";
      commands.push_back(
        this->GetRecursiveMakeCall(makefile2.c_str(), localName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                          localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      if (localName != (*t)->GetName()) {
        commands.clear();
        depends.push_back(localName);
        this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                            (*t)->GetName(), depends, commands, true);
      }

      // Add a fast rule to build the target
      std::string makefileName = this->GetRelativeTargetDirectory(*t);
      makefileName += "/build.make";
      // make sure the makefile name is suitable for a makefile
      std::string makeTargetName = this->GetRelativeTargetDirectory(*t);
      makeTargetName += "/build";
      localName = (*t)->GetName();
      localName += "/fast";
      depends.clear();
      commands.clear();
      commands.push_back(
        this->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "fast build rule for target.",
                          localName, depends, commands, true);

      // Add a local name for the rule to relink the target before
      // installation.
      if ((*t)->NeedRelinkBeforeInstall(this->ConfigName)) {
        makeTargetName = this->GetRelativeTargetDirectory(*t);
        makeTargetName += "/preinstall";
        localName = (*t)->GetName();
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(
          this->GetRecursiveMakeCall(makefile2.c_str(), makeTargetName));
        this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                              this->GetCurrentBinaryDirectory());
        this->WriteMakeRule(ruleFileStream,
                            "Manual pre-install relink rule for target.",
                            localName, depends, commands, true);
      }
    }
  }
}